

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::init_enqueue(Internal *this,int idx)

{
  int iVar1;
  pointer pLVar2;
  long lVar3;
  pointer plVar4;
  
  pLVar2 = (this->links).super__Vector_base<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->opts).reverse == 0) {
    pLVar2[idx].next = 0;
    iVar1 = (this->queue).last;
    if ((long)iVar1 == 0) {
      (this->queue).first = idx;
    }
    else {
      pLVar2[iVar1].next = idx;
    }
    lVar3 = (this->stats).bumped + 1;
    (this->stats).bumped = lVar3;
    (this->btab).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start[idx] = lVar3;
    pLVar2[idx].prev = iVar1;
    (this->queue).last = idx;
    (this->queue).unassigned = idx;
  }
  else {
    pLVar2[idx].prev = 0;
    iVar1 = (this->queue).first;
    lVar3 = (long)iVar1;
    if (lVar3 == 0) {
      (this->queue).last = idx;
      plVar4 = (this->btab).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = 0;
    }
    else {
      pLVar2[lVar3].prev = idx;
      plVar4 = (this->btab).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = plVar4[lVar3] + -1;
    }
    plVar4[idx] = lVar3;
    pLVar2[idx].next = iVar1;
    (this->queue).first = idx;
    if ((this->queue).unassigned != 0) {
      return;
    }
    iVar1 = (this->queue).last;
    (this->queue).unassigned = iVar1;
    lVar3 = plVar4[iVar1];
  }
  (this->queue).bumped = lVar3;
  return;
}

Assistant:

inline void Internal::init_enqueue (int idx) {
  Link &l = links[idx];
  if (opts.reverse) {
    l.prev = 0;
    if (queue.first) {
      assert (!links[queue.first].prev);
      links[queue.first].prev = idx;
      btab[idx] = btab[queue.first] - 1;
    } else {
      assert (!queue.last);
      queue.last = idx;
      btab[idx] = 0;
    }
    assert (btab[idx] <= stats.bumped);
    l.next = queue.first;
    queue.first = idx;
    if (!queue.unassigned)
      update_queue_unassigned (queue.last);
  } else {
    l.next = 0;
    if (queue.last) {
      assert (!links[queue.last].next);
      links[queue.last].next = idx;
    } else {
      assert (!queue.first);
      queue.first = idx;
    }
    btab[idx] = ++stats.bumped;
    l.prev = queue.last;
    queue.last = idx;
    update_queue_unassigned (queue.last);
  }
}